

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::VSliderScalar
               (char *label,ImVec2 *size,ImGuiDataType data_type,void *v,void *v_min,void *v_max,
               char *format,float power)

{
  bool bVar1;
  int iVar2;
  int in_EDX;
  float _x;
  char *in_stack_00000008;
  char *value_buf_end;
  char value_buf [64];
  bool value_changed;
  ImRect grab_bb;
  ImU32 frame_col;
  bool hovered;
  ImRect bb;
  ImRect frame_bb;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffe38;
  char *data_ptr;
  undefined4 in_stack_fffffffffffffe40;
  ImGuiDataType data_type_00;
  ImGuiID in_stack_fffffffffffffe44;
  ImRect *in_stack_fffffffffffffe48;
  char *pcVar3;
  float in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe54;
  ImRect *in_stack_fffffffffffffe58;
  ImDrawList *a;
  ImGuiWindow *in_stack_fffffffffffffe60;
  ImDrawList *this;
  ImGuiWindow *in_stack_fffffffffffffe68;
  ImVec2 *align;
  undefined8 in_stack_fffffffffffffe70;
  ImVec2 *pIVar4;
  ImRect *in_stack_fffffffffffffe78;
  ImVec2 *text_end;
  undefined1 hide_text_after_hash;
  ImVec2 *pos_max;
  float in_stack_fffffffffffffe90;
  float fVar5;
  ImGuiSliderFlags flags;
  undefined4 in_stack_fffffffffffffea0;
  ImVec2 p_max;
  ImVec2 IVar6;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 *local_120;
  float in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffeec;
  ImRect *in_stack_fffffffffffffef0;
  undefined1 local_c8 [52];
  ImVec2 local_94;
  ImRect local_8c;
  ImVec2 local_7c;
  ImRect local_74;
  ImVec2 local_64;
  ImGuiID local_5c;
  ImGuiStyle *local_58;
  ImGuiContext *local_50;
  ImGuiWindow *local_48;
  int local_1c;
  bool local_1;
  
  local_1c = in_EDX;
  local_48 = GetCurrentWindow();
  if ((local_48->SkipItems & 1U) == 0) {
    local_50 = GImGui;
    local_58 = &GImGui->Style;
    p_max.x = 0.0;
    p_max.y = 0.0;
    local_5c = ImGuiWindow::GetID(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                                  (char *)CONCAT44(in_stack_fffffffffffffe54,
                                                   in_stack_fffffffffffffe50));
    local_64 = CalcTextSize((char *)in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60,
                            SUB81((ulong)in_stack_fffffffffffffe58 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffe58,0));
    IVar6 = (ImVec2)&local_48->DC;
    local_7c = operator+(in_stack_fffffffffffffe38,(ImVec2 *)0x17ea48);
    ImRect::ImRect(&local_74,(ImVec2 *)IVar6,&local_7c);
    if (local_64.x <= 0.0) {
      _x = 0.0;
    }
    else {
      _x = (local_58->ItemInnerSpacing).x + local_64.x;
    }
    pIVar4 = (ImVec2 *)(local_c8 + 0x2c);
    ImVec2::ImVec2(pIVar4,_x,0.0);
    local_94 = operator+(in_stack_fffffffffffffe38,(ImVec2 *)0x17eaf6);
    fVar5 = (float)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    ImRect::ImRect(&local_8c,&local_74.Min,&local_94);
    ItemSize((ImRect *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),fVar5);
    bVar1 = ItemAdd((ImRect *)in_stack_fffffffffffffe68,
                    (ImGuiID)((ulong)in_stack_fffffffffffffe60 >> 0x20),in_stack_fffffffffffffe58);
    if (bVar1) {
      if (in_stack_00000008 == (char *)0x0) {
        in_stack_00000008 = GDataTypeInfo[local_1c].PrintFmt;
      }
      else if ((local_1c == 0) && (iVar2 = strcmp(in_stack_00000008,"%d"), iVar2 != 0)) {
        in_stack_00000008 = PatchFormatStringFloatToInt((char *)in_stack_fffffffffffffe48);
      }
      local_c8[0x2b] = ItemHoverable(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
      if (((((bool)local_c8[0x2b]) && (((local_50->IO).MouseClicked[0] & 1U) != 0)) ||
          (local_50->NavActivateId == local_5c)) || (local_50->NavInputId == local_5c)) {
        SetActiveID(local_5c,local_48);
        SetFocusID((ImGuiID)((ulong)in_stack_fffffffffffffe70 >> 0x20),in_stack_fffffffffffffe68);
        FocusWindow((ImGuiWindow *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        local_50->ActiveIdAllowNavDirFlags = 3;
      }
      if (local_50->ActiveId == local_5c) {
        fVar5 = 1.26117e-44;
      }
      else {
        fVar5 = 9.80909e-45;
        if (local_50->HoveredId == local_5c) {
          fVar5 = 1.12104e-44;
        }
      }
      local_c8._36_4_ = GetColorU32((ImGuiCol)in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
      RenderNavHighlight(in_stack_fffffffffffffef0,(ImGuiID)in_stack_fffffffffffffeec,
                         (ImGuiNavHighlightFlags)in_stack_fffffffffffffee8);
      RenderFrame(IVar6,p_max,(ImU32)_x,SUB41((uint)in_stack_fffffffffffffea0 >> 0x18,0),
                  (float)((ulong)pIVar4 >> 0x20));
      flags = (ImGuiSliderFlags)pIVar4;
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      pcVar3 = local_c8;
      data_type_00 = 1;
      data_ptr = in_stack_00000008;
      bVar1 = SliderBehavior(in_stack_fffffffffffffe78,
                             (ImGuiID)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                             (ImGuiDataType)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                             in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                             (char *)CONCAT44(fVar5,in_stack_fffffffffffffe90),
                             in_stack_fffffffffffffe54,flags,
                             (ImRect *)CONCAT44(_x,in_stack_fffffffffffffea0));
      if (bVar1) {
        MarkItemEdited(local_5c);
      }
      a = local_48->DrawList;
      this = (ImDrawList *)local_c8;
      align = (ImVec2 *)(local_c8 + 8);
      GetColorU32((ImGuiCol)in_stack_fffffffffffffe54,in_stack_fffffffffffffe50);
      ImDrawList::AddRectFilled
                (this,(ImVec2 *)a,
                 (ImVec2 *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (ImU32)((ulong)pcVar3 >> 0x20),SUB84(pcVar3,0),in_stack_fffffffffffffe44);
      pIVar4 = (ImVec2 *)&stack0xfffffffffffffee8;
      iVar2 = DataTypeFormatString
                        (pcVar3,in_stack_fffffffffffffe44,data_type_00,data_ptr,(char *)0x17ee8e);
      local_120 = (ImVec2 *)((long)&pIVar4->x + (long)iVar2);
      ImVec2::ImVec2(&local_128,local_74.Min.x,local_74.Min.y + (local_58->FramePadding).y);
      text_end = &local_74.Max;
      pcVar3 = &stack0xfffffffffffffee8;
      pos_max = local_120;
      ImVec2::ImVec2(&local_130,0.5,0.0);
      RenderTextClipped((ImVec2 *)CONCAT44(fVar5,in_stack_fffffffffffffe90),pos_max,pcVar3,
                        (char *)text_end,pIVar4,align,
                        (ImRect *)CONCAT44(_x,in_stack_fffffffffffffea0));
      hide_text_after_hash = (undefined1)((ulong)text_end >> 0x38);
      local_1 = bVar1;
      if (0.0 < local_64.x) {
        ImVec2::ImVec2(&local_138,local_74.Max.x + (local_58->ItemInnerSpacing).x,
                       local_74.Min.y + (local_58->FramePadding).y);
        IVar6.y = fVar5;
        IVar6.x = in_stack_fffffffffffffe90;
        RenderText(IVar6,(char *)pos_max,pcVar3,(bool)hide_text_after_hash);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::VSliderScalar(const char* label, const ImVec2& size, ImGuiDataType data_type, void* v, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    ItemSize(bb, style.FramePadding.y);
    if (!ItemAdd(frame_bb, id))
        return false;

    // Default format string when passing NULL
    // Patch old "%.0f" format string to use "%d", read function comments for more details.
    IM_ASSERT(data_type >= 0 && data_type < ImGuiDataType_COUNT);
    if (format == NULL)
        format = GDataTypeInfo[data_type].PrintFmt;
    else if (data_type == ImGuiDataType_S32 && strcmp(format, "%d") != 0)
        format = PatchFormatStringFloatToInt(format);

    const bool hovered = ItemHoverable(frame_bb, id);
    if ((hovered && g.IO.MouseClicked[0]) || g.NavActivateId == id || g.NavInputId == id)
    {
        SetActiveID(id, window);
        SetFocusID(id, window);
        FocusWindow(window);
        g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Left) | (1 << ImGuiDir_Right);
    }

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, g.Style.FrameRounding);

    // Slider behavior
    ImRect grab_bb;
    const bool value_changed = SliderBehavior(frame_bb, id, data_type, v, v_min, v_max, format, power, ImGuiSliderFlags_Vertical, &grab_bb);
    if (value_changed)
        MarkItemEdited(id);

    // Render grab
    window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    // For the vertical slider we allow centered text to overlap the frame padding
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, v, format);
    RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f,0.0f));
    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    return value_changed;
}